

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O0

int Mio_CompareTwo(Mio_Cell_t *pCell,Mio_Gate_t *pGate)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float GateDelay;
  float CellDelay;
  float Eps;
  int Comp;
  Mio_Gate_t *pGate_local;
  Mio_Cell_t *pCell_local;
  
  if (pCell->Area <= (float)pGate->dArea + 0.0094636) {
    if ((float)pGate->dArea - 0.0094636 <= pCell->Area) {
      fVar2 = Mio_CellDelayAve(pCell);
      fVar3 = Mio_GateDelayAve(pGate);
      if (fVar2 <= fVar3 + 0.0094636) {
        if (fVar3 - 0.0094636 <= fVar2) {
          iVar1 = strcmp(pCell->pName,pGate->pName);
          if (iVar1 < 1) {
            if (-1 < iVar1) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/mioUtils.c"
                            ,0x25b,"int Mio_CompareTwo(Mio_Cell_t *, Mio_Gate_t *)");
            }
            pCell_local._4_4_ = 0;
          }
          else {
            pCell_local._4_4_ = 1;
          }
        }
        else {
          pCell_local._4_4_ = 0;
        }
      }
      else {
        pCell_local._4_4_ = 1;
      }
    }
    else {
      pCell_local._4_4_ = 0;
    }
  }
  else {
    pCell_local._4_4_ = 1;
  }
  return pCell_local._4_4_;
}

Assistant:

static inline int Mio_CompareTwo( Mio_Cell_t * pCell, Mio_Gate_t * pGate )
{
    int Comp;
    float Eps = (float)0.0094636;
    float CellDelay, GateDelay;
    // compare areas
    if ( pCell->Area > (float)pGate->dArea + Eps )
        return 1;
    if ( pCell->Area < (float)pGate->dArea - Eps )
        return 0;
    // compare delays
    CellDelay = Mio_CellDelayAve( pCell );
    GateDelay = Mio_GateDelayAve( pGate );
    if ( CellDelay > GateDelay + Eps )
        return 1;
    if ( CellDelay < GateDelay - Eps )
        return 0;
    // compare names
    Comp = strcmp( pCell->pName, pGate->pName );
    if ( Comp > 0 )
        return 1;
    if ( Comp < 0 )
        return 0;
    assert( 0 );
    return 0;
}